

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O1

Var Js::JavascriptMath::Multiply_InPlace
              (Var aLeft,Var aRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  Type TVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  RecyclableObject *pRVar8;
  Var pvVar9;
  JavascriptNumber *pJVar10;
  ulong uVar11;
  double dVar12;
  Type TVar13;
  ulong uVar14;
  double dVar15;
  
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00aab9d7;
    *puVar7 = 0;
  }
  uVar14 = (ulong)aLeft & 0xffff000000000000;
  bVar2 = ((ulong)aLeft & 0x1ffff00000000) != 0x1000000000000;
  if (bVar2 && uVar14 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00aab9d7;
    *puVar7 = 0;
  }
  TVar5 = TypeIds_FirstNumberType;
  if ((uVar14 != 0x1000000000000) && (TVar5 = TypeIds_Number, aLeft < (Var)0x4000000000000)) {
    pRVar8 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
    if (pRVar8 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00aab9d7;
      *puVar7 = 0;
    }
    TVar5 = ((pRVar8->type).ptr)->typeId;
    if ((0x57 < (int)TVar5) && (BVar6 = RecyclableObject::IsExternal(pRVar8), BVar6 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) goto LAB_00aab9d7;
      *puVar7 = 0;
    }
  }
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00aab9d7;
    *puVar7 = 0;
  }
  uVar11 = (ulong)aRight & 0xffff000000000000;
  bVar3 = ((ulong)aRight & 0x1ffff00000000) != 0x1000000000000;
  if (bVar3 && uVar11 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00aab9d7;
    *puVar7 = 0;
  }
  TVar13 = TypeIds_FirstNumberType;
  if ((uVar11 != 0x1000000000000) && (TVar13 = TypeIds_Number, aRight < (Var)0x4000000000000)) {
    pRVar8 = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (pRVar8 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00aab9d7;
      *puVar7 = 0;
    }
    TVar13 = ((pRVar8->type).ptr)->typeId;
    if ((0x57 < (int)TVar13) && (BVar6 = RecyclableObject::IsExternal(pRVar8), BVar6 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_00aab9d7;
      *puVar7 = 0;
    }
  }
  if ((TVar5 == TypeIds_BigInt) || (TVar13 == TypeIds_BigInt)) {
    if (TVar13 != TVar5) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fff3,L"Multiply BigInt");
    }
    pvVar9 = JavascriptBigInt::Mul(aLeft,aRight);
    return pvVar9;
  }
  if (aLeft < (Var)0x4000000000000) {
    if (aRight < (Var)0x4000000000000) {
      bVar2 = TaggedInt::IsPair(aLeft,aRight);
      if (bVar2) {
        pvVar9 = TaggedInt::MultiplyInPlace(aLeft,aRight,scriptContext,result);
        return pvVar9;
      }
LAB_00aab9b0:
      dVar15 = Multiply_Helper(aLeft,aRight,scriptContext);
      pJVar10 = JavascriptNumber::InPlaceNew(dVar15,scriptContext,result);
      return pJVar10;
    }
    if (bVar2 && uVar14 == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00aab9d7;
      *puVar7 = 0;
    }
    if (uVar14 != 0x1000000000000) goto LAB_00aab9b0;
    dVar12 = (double)(int)aLeft;
    dVar15 = (double)((ulong)aRight ^ 0xfffc000000000000);
  }
  else {
    if ((Var)0x3ffffffffffff < aRight) {
      dVar15 = (double)((ulong)aRight ^ 0xfffc000000000000) *
               (double)((ulong)aLeft ^ 0xfffc000000000000);
      goto LAB_00aab967;
    }
    if (bVar3 && uVar11 == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) {
LAB_00aab9d7:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    if (uVar11 != 0x1000000000000) goto LAB_00aab9b0;
    dVar12 = (double)((ulong)aLeft ^ 0xfffc000000000000);
    dVar15 = (double)(int)aRight;
  }
  dVar15 = dVar15 * dVar12;
LAB_00aab967:
  pvVar9 = JavascriptNumber::ToVarInPlace(dVar15,scriptContext,result);
  return pvVar9;
}

Assistant:

Var JavascriptMath::Multiply_InPlace(Var aLeft, Var aRight, ScriptContext* scriptContext, JavascriptNumber* result)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_MultiplyInPlace);

            Js::TypeId typeLeft = JavascriptOperators::GetTypeId(aLeft);
            Js::TypeId typeRight = JavascriptOperators::GetTypeId(aRight);
            if (typeLeft == TypeIds_BigInt || typeRight == TypeIds_BigInt)
            {
                if (typeRight != typeLeft)
                {
                    JavascriptError::ThrowTypeError(scriptContext, VBSERR_TypeMismatch, _u("Multiply BigInt"));
                }
                return JavascriptBigInt::Mul(aLeft, aRight);
            }

            if(JavascriptNumber::Is(aLeft))
            {
                if(JavascriptNumber::Is(aRight))
                {
                    return JavascriptNumber::ToVarInPlace(
                        JavascriptNumber::GetValue(aLeft) * JavascriptNumber::GetValue(aRight), scriptContext, result);
                }
                else if (TaggedInt::Is(aRight))
                {
                    return JavascriptNumber::ToVarInPlace(
                        JavascriptNumber::GetValue(aLeft) * TaggedInt::ToDouble(aRight), scriptContext, result);
                }
            }
            else if(JavascriptNumber::Is(aRight))
            {
                if(TaggedInt::Is(aLeft))
                {
                    return JavascriptNumber::ToVarInPlace(
                        TaggedInt::ToDouble(aLeft) * JavascriptNumber::GetValue(aRight), scriptContext, result);
                }
            }
            else if(TaggedInt::IsPair(aLeft, aRight))
            {
                return TaggedInt::MultiplyInPlace(aLeft, aRight, scriptContext, result);
            }
            double product = Multiply_Helper(aLeft, aRight, scriptContext);
            return JavascriptNumber::InPlaceNew(product, scriptContext, result);
            JIT_HELPER_END(Op_MultiplyInPlace);
        }